

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_dgeadd_is(int m,int n,double *a,int lda,double *b,int ldb)

{
  uint __line;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *__assertion;
  int j;
  ulong uVar4;
  
  if (a == (double *)0x0) {
    __assertion = "a";
    __line = 0x3b;
  }
  else if (b == (double *)0x0) {
    __assertion = "b";
    __line = 0x3c;
  }
  else if ((lda < 1) || (lda < n)) {
    __assertion = "lda >= 1 && lda >= n";
    __line = 0x3d;
  }
  else {
    if ((0 < ldb) && (n <= ldb)) {
      uVar1 = 0;
      uVar2 = (ulong)(uint)n;
      if (n < 1) {
        uVar2 = uVar1;
      }
      uVar3 = (ulong)(uint)m;
      if (m < 1) {
        uVar3 = uVar1;
      }
      for (; uVar1 != uVar3; uVar1 = uVar1 + 1) {
        for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
          b[uVar4] = a[uVar4] + b[uVar4];
        }
        b = b + (uint)ldb;
        a = a + (uint)lda;
      }
      return;
    }
    __assertion = "ldb >= 1 && ldb >= n";
    __line = 0x3e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,__line,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
}

Assistant:

void la_dgeadd_is(
        int m, int n,
        const double *a, int lda,
        double *b, int ldb)
{
    assert(a);
    assert(b);
    assert(lda >= 1 && lda >= n);
    assert(ldb >= 1 && ldb >= n);

    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            b[i * ldb + j] += a[i * lda + j];
        }
    }
}